

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

void __thiscall
cmCTestCVS::LoadRevisions
          (cmCTestCVS *this,string *file,char *branchFlag,
          vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revisions)

{
  cmCTest *this_00;
  ostream *this_01;
  char *msg;
  undefined1 local_610 [8];
  OutputLogger err;
  LogParser out;
  char *cvs_log [6];
  char *cvs;
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revisions_local;
  char *branchFlag_local;
  string *file_local;
  cmCTestCVS *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  this_01 = std::operator<<((ostream *)local_1a0,".");
  std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  this_00 = (this->super_cmCTestVC).CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0xde,msg,false);
  std::__cxx11::string::~string((string *)&cvs);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  out.Rev.Log.field_2._8_8_ = std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  LogParser::LogParser((LogParser *)&err.super_LineParser.Separator,this,"log-out> ",revisions);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_610,(this->super_cmCTestVC).Log,"log-err> ");
  cmCTestVC::RunChild(&this->super_cmCTestVC,(char **)((long)&out.Rev.Log.field_2 + 8),
                      (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_610,
                      (char *)0x0,Auto);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_610);
  LogParser::~LogParser((LogParser *)&err.super_LineParser.Separator);
  return;
}

Assistant:

void cmCTestCVS::LoadRevisions(std::string const& file, const char* branchFlag,
                               std::vector<Revision>& revisions)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Run "cvs log" to get revisions of this file on this branch.
  const char* cvs = this->CommandLineTool.c_str();
  const char* cvs_log[] = {
    cvs, "log", "-N", branchFlag, file.c_str(), nullptr
  };

  LogParser out(this, "log-out> ", revisions);
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(cvs_log, &out, &err);
}